

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrExp.c
# Opt level: O1

void Rwt_Man4ExplorePrint(void)

{
  int *piVar1;
  size_t __size;
  uint uVar2;
  int iVar3;
  int *piVar4;
  bool bVar5;
  Rwr_Man4_t *pRVar6;
  uint in_EAX;
  void *__s;
  void *__ptr;
  FILE *__stream;
  long lVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  if (s_pManRwrExp4->nFuncs < 1) {
    uVar9 = 0;
    uVar10 = 0;
    iVar8 = 0;
  }
  else {
    lVar7 = 0;
    iVar8 = 0;
    uVar10 = 0;
    uVar9 = 0;
    do {
      uVar2 = s_pManRwrExp4->pnCounts[lVar7];
      if ((int)uVar9 <= (int)uVar2) {
        uVar9 = uVar2;
      }
      uVar10 = (ulong)((int)uVar10 + uVar2);
      iVar8 = iVar8 + (uint)(0 < (int)uVar2);
      lVar7 = lVar7 + 1;
      uStack_38 = CONCAT44((int)lVar7,(undefined4)uStack_38);
    } while (lVar7 < s_pManRwrExp4->nFuncs);
  }
  printf("Number of cuts considered       = %8d.\n",uVar10);
  printf("Classes occurring at least once = %8d.\n");
  __size = (ulong)uVar9 * 4 + 4;
  __s = malloc(__size);
  __ptr = malloc(__size);
  memset(__s,0,__size);
  pRVar6 = s_pManRwrExp4;
  uStack_38 = uStack_38 & 0xffffffff;
  if (0 < s_pManRwrExp4->nFuncs) {
    piVar4 = s_pManRwrExp4->pnCounts;
    lVar7 = 0;
    do {
      iVar3 = piVar4[lVar7];
      piVar1 = (int *)((long)__s + (long)iVar3 * 4);
      *piVar1 = *piVar1 + 1;
      *(int *)((long)__ptr + (long)iVar3 * 4) = (int)lVar7;
      lVar7 = lVar7 + 1;
      uStack_38 = CONCAT44((int)lVar7,(undefined4)uStack_38);
    } while (lVar7 < pRVar6->nFuncs);
  }
  printf("Occurence = %6d.  Num classes = %4d.  \n",0,(ulong)(0x8f0 - iVar8));
  uStack_38._4_4_ = 1;
  if (0 < (int)uVar9) {
    do {
      if (*(int *)((long)__s + (long)uStack_38._4_4_ * 4) != 0) {
        printf("Occurence = %6d.  Num classes = %4d.  Repr = ");
        Extra_PrintBinary(_stdout,(uint *)((long)__ptr + (long)uStack_38._4_4_ * 4),0x10);
        putchar(10);
      }
      iVar8 = uStack_38._4_4_ + 1;
      bVar5 = uStack_38._4_4_ < (int)uVar9;
      uStack_38._4_4_ = iVar8;
    } while (bVar5);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  __stream = fopen("npnclass_stats4.txt","w");
  uStack_38._4_4_ = 0;
  if (s_pManRwrExp4->nFuncs < 1) {
    uVar9 = 0;
  }
  else {
    uVar9 = 0;
    do {
      if (0 < s_pManRwrExp4->pnCounts[uStack_38._4_4_]) {
        Extra_PrintHex((FILE *)__stream,(uint *)((long)&uStack_38 + 4),4);
        fprintf(__stream," %10d\n",(ulong)(uint)s_pManRwrExp4->pnCounts[uStack_38._4_4_]);
        uVar9 = uVar9 + 1;
      }
      uStack_38._4_4_ = uStack_38._4_4_ + 1;
    } while (uStack_38._4_4_ < s_pManRwrExp4->nFuncs);
  }
  fclose(__stream);
  printf("%d classes written into file \"%s\".\n",(ulong)uVar9,"npnclass_stats4.txt");
  return;
}

Assistant:

void Rwt_Man4ExplorePrint()
{
    FILE * pFile;
    int i, CountMax, CountWrite, nCuts, nClasses;
    int * pDistrib;
    int * pReprs;
    // find the max number of occurences
    nCuts = nClasses = 0;
    CountMax = 0;
    for ( i = 0; i < s_pManRwrExp4->nFuncs; i++ )
    {
        if ( CountMax < s_pManRwrExp4->pnCounts[i] )
            CountMax = s_pManRwrExp4->pnCounts[i];
        nCuts += s_pManRwrExp4->pnCounts[i];
        if ( s_pManRwrExp4->pnCounts[i] > 0 )
            nClasses++;
    }
    printf( "Number of cuts considered       = %8d.\n", nCuts );
    printf( "Classes occurring at least once = %8d.\n", nClasses );
    // print the distribution of classes
    pDistrib = ABC_ALLOC( int, CountMax + 1 );
    pReprs   = ABC_ALLOC( int, CountMax + 1 );
    memset( pDistrib, 0, sizeof(int)*(CountMax + 1) );
    for ( i = 0; i < s_pManRwrExp4->nFuncs; i++ )
    {
        pDistrib[ s_pManRwrExp4->pnCounts[i] ]++;
        pReprs[ s_pManRwrExp4->pnCounts[i] ] = i;
    }

    printf( "Occurence = %6d.  Num classes = %4d.  \n", 0, 2288-nClasses );
    for ( i = 1; i <= CountMax; i++ )
        if ( pDistrib[i] )
        {
            printf( "Occurence = %6d.  Num classes = %4d.  Repr = ", i, pDistrib[i] );
            Extra_PrintBinary( stdout, (unsigned*)&(pReprs[i]), 16 ); 
            printf( "\n" );
        }
    ABC_FREE( pDistrib );
    ABC_FREE( pReprs );
    // write into a file all classes above limit (5)
    CountWrite = 0;
    pFile = fopen( "npnclass_stats4.txt", "w" );
    for ( i = 0; i < s_pManRwrExp4->nFuncs; i++ )
        if ( s_pManRwrExp4->pnCounts[i] > 0 )
        {
            Extra_PrintHex( pFile, (unsigned *)&i, 4 );
            fprintf( pFile, " %10d\n", s_pManRwrExp4->pnCounts[i] );
//            fprintf( pFile, "%d ", i );
            CountWrite++;
        }
    fclose( pFile );
    printf( "%d classes written into file \"%s\".\n", CountWrite, "npnclass_stats4.txt" );
}